

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpClient::Response> __thiscall
kj::anon_unknown_31::ConcurrencyLimitingHttpClient::attachCounter
          (ConcurrencyLimitingHttpClient *this,Promise<kj::HttpClient::Response> *promise,
          ConnectionCounter *counter)

{
  ConnectionCounter *other;
  PromiseNode *extraout_RDX;
  Promise<kj::HttpClient::Response> PVar1;
  PropagateException local_28 [8];
  ConnectionCounter *local_20;
  ConnectionCounter *counter_local;
  Promise<kj::HttpClient::Response> *promise_local;
  
  local_20 = counter;
  counter_local = (ConnectionCounter *)promise;
  promise_local = (Promise<kj::HttpClient::Response> *)this;
  other = mv<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>(counter);
  ConnectionCounter::ConnectionCounter((ConnectionCounter *)local_28,other);
  Promise<kj::HttpClient::Response>::
  then<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::attachCounter(kj::Promise<kj::HttpClient::Response>&&,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)::_lambda(kj::HttpClient::Response&&)_1_,kj::_::PropagateException>
            ((Promise<kj::HttpClient::Response> *)this,(Type *)promise,local_28);
  (anonymous_namespace)::ConcurrencyLimitingHttpClient::
  attachCounter(kj::Promise<kj::HttpClient::Response>&&,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)
  ::{lambda(kj::HttpClient::Response&&)#1}::~ConnectionCounter
            ((_lambda_kj__HttpClient__Response____1_ *)local_28);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::HttpClient::Response>)PVar1.super_PromiseBase.node;
}

Assistant:

static kj::Promise<Response> attachCounter(kj::Promise<Response>&& promise,
                                             ConnectionCounter&& counter) {
    return promise.then([counter = kj::mv(counter)](Response&& response) mutable {
      return Response {
        response.statusCode,
        response.statusText,
        response.headers,
        response.body.attach(kj::mv(counter))
      };
    });
  }